

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_oh_replace_stream_data
               (qpdf_data qpdf,qpdf_oh stream_oh,uchar *buf,size_t len,qpdf_oh filter_oh,
               qpdf_oh decode_parms_oh)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(qpdf_data *)local_58._M_unused._0_8_ = qpdf;
  *(uchar **)((long)local_58._M_unused._0_8_ + 8) = buf;
  *(size_t *)((long)local_58._M_unused._0_8_ + 0x10) = len;
  *(qpdf_oh *)((long)local_58._M_unused._0_8_ + 0x18) = filter_oh;
  *(qpdf_oh *)((long)local_58._M_unused._0_8_ + 0x1c) = decode_parms_oh;
  pcStack_40 = std::
               _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1794:26)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1794:26)>
             ::_M_manager;
  do_with_oh_void(qpdf,stream_oh,(function<void_(QPDFObjectHandle_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_oh_replace_stream_data(
    qpdf_data qpdf,
    qpdf_oh stream_oh,
    unsigned char const* buf,
    size_t len,
    qpdf_oh filter_oh,
    qpdf_oh decode_parms_oh)
{
    do_with_oh_void(
        qpdf, stream_oh, [qpdf, buf, len, filter_oh, decode_parms_oh](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_stream_data");
            auto filter = qpdf_oh_item_internal(qpdf, filter_oh);
            auto decode_parms = qpdf_oh_item_internal(qpdf, decode_parms_oh);
            // XXX test with binary data with null
            o.replaceStreamData(
                std::string(reinterpret_cast<char const*>(buf), len), filter, decode_parms);
        });
}